

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polylinecurve.cpp
# Opt level: O1

ON_PolylineCurve * __thiscall
ON_PolylineCurve::operator=(ON_PolylineCurve *this,ON_3dPointArray *src)

{
  uint uVar1;
  double *pdVar2;
  ulong uVar3;
  
  ON_Polyline::operator=(&this->m_pline,src);
  this->m_dim = 3;
  uVar1 = (src->super_ON_SimpleArray<ON_3dPoint>).m_count;
  if ((uint)(this->m_t).m_capacity < uVar1) {
    ON_SimpleArray<double>::SetCapacity(&this->m_t,(long)(int)uVar1);
  }
  if ((-1 < (int)uVar1) && ((int)uVar1 <= (this->m_t).m_capacity)) {
    (this->m_t).m_count = uVar1;
  }
  if (0 < (int)uVar1) {
    pdVar2 = (this->m_t).m_a;
    uVar3 = 0;
    do {
      pdVar2[uVar3] = (double)(int)uVar3;
      uVar3 = uVar3 + 1;
    } while (uVar1 != uVar3);
  }
  return this;
}

Assistant:

ON_PolylineCurve& ON_PolylineCurve::operator=( const ON_3dPointArray& src )
{
  m_pline = src;
  m_dim   = 3;
  const int count = src.Count();
  m_t.Reserve(count);
  m_t.SetCount(count);
  int i;
  for (i = 0; i < count; i++) {
    m_t[i] = (double)i;
  }
  return *this;
}